

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  Sub *local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  undefined1 local_281;
  anon_class_24_3_4e50317f_for_cb local_280;
  allocator<char> local_261;
  string local_260;
  char *local_240;
  allocator<char> local_231;
  string local_230;
  Sub *local_210;
  Sub local_208;
  Sub local_150;
  iterator local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88 [2];
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_68;
  Span<const_google::protobuf::io::Printer::Sub> local_50;
  undefined1 local_40 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Printer *p_local;
  undefined8 uStack_18;
  bool is_inline_local;
  FieldDescriptor *field_local;
  MessageGenerator *this_local;
  
  t.storage_.callback_buffer_._8_8_ = p;
  uStack_18 = field;
  field_local = (FieldDescriptor *)this;
  MakeTrackerCalls(&local_68,field,&this->options_);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_50,&local_68);
  protobuf::io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_40,p,local_50);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_68);
  uVar1 = t.storage_.callback_buffer_._8_8_;
  local_281 = 1;
  local_210 = &local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"inline",&local_231);
  local_240 = anon_var_dwarf_37cdd0 + 5;
  if (is_inline) {
    local_240 = "inline";
  }
  protobuf::io::Printer::Sub::Sub<char_const*>(&local_208,&local_230,&local_240);
  local_210 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"body",&local_261);
  local_280.field = (FieldDescriptor **)&stack0xffffffffffffffe8;
  local_280.p = (Printer **)(t.storage_.callback_buffer_ + 8);
  local_280.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear(google::protobuf::FieldDescriptor_const*,bool,google::protobuf::io::Printer*)::__0>
            (&local_150,&local_260,&local_280);
  local_281 = 0;
  local_98 = &local_208;
  local_90 = 2;
  v._M_len = 2;
  v._M_array = local_98;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_88[0]._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_298,
             "\n            $inline $void $classname$::clear_$name$() {\n              $pbi$::TSanWrite(&_impl_);\n              $WeakDescriptorSelfPin$;\n              $body$;\n              $annotate_clear$;\n            }\n          "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            ((Printer *)uVar1,local_88[0]._M_allocated_capacity,local_88[0]._8_8_,local_298._M_len,
             local_298._M_str);
  local_2e0 = (Sub *)&local_98;
  do {
    local_2e0 = local_2e0 + -1;
    protobuf::io::Printer::Sub::~Sub(local_2e0);
  } while (local_2e0 != &local_208);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_40);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, io::Printer* p) {
  auto t = p->WithVars(MakeTrackerCalls(field, options_));
  p->Emit({{"inline", is_inline ? "inline" : ""},
           {"body",
            [&] {
              if (field->real_containing_oneof()) {
                // Clear this field only if it is the active field in this
                // oneof, otherwise ignore
                p->Emit(
                    {{"clearing_code",
                      [&] {
                        field_generators_.get(field).GenerateClearingCode(p);
                      }}},
                    R"cc(
                      if ($has_field$) {
                        $clearing_code$;
                        clear_has_$oneof_name$();
                      }
                    )cc");
              } else {
                // TODO: figure out if early return breaks tracking
                if (ShouldSplit(field, options_)) {
                  p->Emit(R"cc(
                    if (ABSL_PREDICT_TRUE(IsSplitMessageDefault()))
                      return;
                  )cc");
                }
                field_generators_.get(field).GenerateClearingCode(p);
                if (HasHasbit(field)) {
                  auto v = p->WithVars(HasBitVars(field));
                  p->Emit(R"cc(
                    $has_bits$[$has_array_index$] &= ~$has_mask$;
                  )cc");
                }
              }
            }}},
          R"cc(
            $inline $void $classname$::clear_$name$() {
              $pbi$::TSanWrite(&_impl_);
              $WeakDescriptorSelfPin$;
              $body$;
              $annotate_clear$;
            }
          )cc");
}